

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * __thiscall
vkt::shaderexecutor::
ApplyVar<vkt::shaderexecutor::Signature<float,_float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            ApplyVar<vkt::shaderexecutor::Signature<float,_float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *this,EvalContext *ctx)

{
  ApplyFunc *pAVar1;
  Variable<int> *variable;
  Variable<vkt::shaderexecutor::Void> *variable_00;
  Variable<vkt::shaderexecutor::Void> *variable_01;
  
  pAVar1 = (this->
           super_Apply<vkt::shaderexecutor::Signature<float,_float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
           ).m_func;
  variable = (Variable<int> *)
             (this->
             super_Apply<vkt::shaderexecutor::Signature<float,_float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
             ).m_args.b.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>.
             m_ptr;
  variable_00 = (Variable<vkt::shaderexecutor::Void> *)
                (this->
                super_Apply<vkt::shaderexecutor::Signature<float,_float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                ).m_args.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
                super_ExprPBase<vkt::shaderexecutor::Void>.
                super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr;
  variable_01 = (Variable<vkt::shaderexecutor::Void> *)
                (this->
                super_Apply<vkt::shaderexecutor::Signature<float,_float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                ).m_args.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
                super_ExprPBase<vkt::shaderexecutor::Void>.
                super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr;
  Environment::lookup<float>
            (ctx->env,(Variable<float> *)
                      (this->
                      super_Apply<vkt::shaderexecutor::Signature<float,_float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                      ).m_args.a.super_ExprPBase<float>.
                      super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr);
  Environment::lookup<int>(ctx->env,variable);
  Environment::lookup<vkt::shaderexecutor::Void>(ctx->env,variable_00);
  Environment::lookup<vkt::shaderexecutor::Void>(ctx->env,variable_01);
  (**(code **)(*(long *)pAVar1 + 0x40))(__return_storage_ptr__,pAVar1,ctx);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		const Variable<Arg0>&	var0 = static_cast<const Variable<Arg0>&>(*this->m_args.a);
		const Variable<Arg1>&	var1 = static_cast<const Variable<Arg1>&>(*this->m_args.b);
		const Variable<Arg2>&	var2 = static_cast<const Variable<Arg2>&>(*this->m_args.c);
		const Variable<Arg3>&	var3 = static_cast<const Variable<Arg3>&>(*this->m_args.d);
		return this->m_func.apply(ctx,
								  ctx.env.lookup(var0), ctx.env.lookup(var1),
								  ctx.env.lookup(var2), ctx.env.lookup(var3));
	}